

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>::
operator()(arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
           *this,char_type value)

{
  format_specs *pfVar1;
  char_spec_handler local_40;
  string local_30;
  
  pfVar1 = this->specs_;
  local_40.formatter = this;
  local_40.value = value;
  if (pfVar1 != (format_specs *)0x0) {
    if ((pfVar1->type != '\0') && (pfVar1->type != 'c')) {
      char_spec_handler::on_int(&local_40);
      goto LAB_0029e26f;
    }
    if ((0xf < (byte)pfVar1->field_0x9) || ((pfVar1->field_0x9 & 0xf) == 4)) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"invalid format specifier for char","");
      error_handler::on_error((error_handler *)&local_40,&local_30);
    }
  }
  write_char(this,value);
LAB_0029e26f:
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(char_type value) {
    internal::handle_char_specs(
        specs_, char_spec_handler(*this, static_cast<char_type>(value)));
    return out();
  }